

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O3

int lib::base::DoPairs(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  Value *key_00;
  Value value;
  Value key;
  StackAPI api;
  anon_union_8_9_8deb4486_for_Value_0 local_48;
  undefined4 local_40;
  anon_union_8_9_8deb4486_for_Value_0 local_38;
  undefined4 local_30;
  StackAPI local_28;
  
  luna::StackAPI::StackAPI(&local_28,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_28,2,ValueT_Table);
  iVar2 = 0;
  if (bVar1) {
    this = luna::StackAPI::GetTable(&local_28,0);
    key_00 = luna::StackAPI::GetValue(&local_28,1);
    local_38.obj_ = (GCObject *)0x0;
    local_30 = 0;
    local_48.obj_ = (GCObject *)0x0;
    local_40 = 0;
    if (key_00->type_ == ValueT_Nil) {
      luna::Table::FirstKeyValue(this,(Value *)&local_38,(Value *)&local_48);
    }
    else {
      luna::Table::NextKeyValue(this,key_00,(Value *)&local_38,(Value *)&local_48);
    }
    luna::StackAPI::PushValue(&local_28,(Value *)&local_38);
    luna::StackAPI::PushValue(&local_28,(Value *)&local_48);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int DoPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        luna::Table *t = api.GetTable(0);
        luna::Value *last_key = api.GetValue(1);

        luna::Value key;
        luna::Value value;
        if (last_key->type_ == luna::ValueT_Nil)
            t->FirstKeyValue(key, value);
        else
            t->NextKeyValue(*last_key, key, value);

        api.PushValue(key);
        api.PushValue(value);
        return 2;
    }